

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O3

bool __thiscall hanabi_learning_env::HanabiState::MoveIsLegal(HanabiState *this,HanabiMove move)

{
  pointer pHVar1;
  pointer pHVar2;
  uint uVar3;
  pointer pHVar4;
  pointer pHVar5;
  ulong uVar6;
  char cVar7;
  long lVar8;
  int iVar9;
  bool bVar10;
  
  if (4 < move.move_type_ - kPlay) {
    return false;
  }
  uVar3 = move._4_4_ >> 8;
  switch(move.move_type_) {
  case kDiscard:
    if (this->parent_game_->max_information_tokens_ <= this->information_tokens_) {
      return false;
    }
  case kPlay:
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)move.card_index_ <
        (ulong)((long)*(pointer *)
                       ((long)&pHVar1[this->cur_player_].cards_.
                               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                               ._M_impl + 8) -
                *(long *)&pHVar1[this->cur_player_].cards_.
                          super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                          ._M_impl >> 3)) {
      return true;
    }
    return false;
  case kRevealColor:
    if (move.target_offset_ < '\x01') {
      return false;
    }
    if (this->information_tokens_ < 1) {
      return false;
    }
    if (this->parent_game_->num_players_ <= (int)(uVar3 & 0x7f)) {
      return false;
    }
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)this->cur_player_ + (ulong)(uVar3 & 0x7f)) %
            (ulong)(((long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 4) *
                   -0x5555555555555555);
    pHVar5 = *(pointer *)
              &pHVar1[uVar6].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar2 = *(pointer *)
              ((long)&pHVar1[uVar6].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar6 = (long)pHVar2 - (long)pHVar5;
    cVar7 = move.color_;
    if (0 < (long)uVar6 >> 5) {
      iVar9 = (int)cVar7;
      pHVar4 = (pointer)((long)&pHVar5->color_ + (uVar6 & 0xffffffffffffffe0));
      lVar8 = ((long)uVar6 >> 5) + 1;
      pHVar5 = pHVar5 + 2;
      do {
        if (pHVar5[-2].color_ == iVar9) goto LAB_0011622c;
        if (pHVar5[-1].color_ == iVar9) goto LAB_00116232;
        if (pHVar5->color_ == iVar9) goto LAB_00116282;
        if (pHVar5[1].color_ == iVar9) goto LAB_00116238;
        lVar8 = lVar8 + -1;
        pHVar5 = pHVar5 + 4;
      } while (1 < lVar8);
      uVar6 = (long)pHVar2 - (long)pHVar4;
      pHVar5 = pHVar4;
    }
    lVar8 = (long)uVar6 >> 3;
    if (lVar8 != 1) {
      if (lVar8 == 3) {
        if (pHVar5->color_ == (int)cVar7) goto LAB_00116282;
        pHVar5 = pHVar5 + 1;
      }
      else if (lVar8 != 2) {
        return false;
      }
      if (pHVar5->color_ == (int)cVar7) goto LAB_00116282;
      pHVar5 = pHVar5 + 1;
    }
    bVar10 = pHVar5->color_ == (int)cVar7;
    break;
  case kRevealRank:
    if (move.target_offset_ < '\x01') {
      return false;
    }
    if (this->information_tokens_ < 1) {
      return false;
    }
    if (this->parent_game_->num_players_ <= (int)(uVar3 & 0x7f)) {
      return false;
    }
    pHVar1 = (this->hands_).
             super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)this->cur_player_ + (ulong)(uVar3 & 0x7f)) %
            (ulong)(((long)(this->hands_).
                           super__Vector_base<hanabi_learning_env::HanabiHand,_std::allocator<hanabi_learning_env::HanabiHand>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar1 >> 4) *
                   -0x5555555555555555);
    pHVar5 = *(pointer *)
              &pHVar1[uVar6].cards_.
               super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
               ._M_impl;
    pHVar2 = *(pointer *)
              ((long)&pHVar1[uVar6].cards_.
                      super__Vector_base<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
                      ._M_impl + 8);
    uVar6 = (long)pHVar2 - (long)pHVar5;
    cVar7 = move.rank_;
    if (0 < (long)uVar6 >> 5) {
      iVar9 = (int)cVar7;
      pHVar4 = (pointer)((long)&pHVar5->color_ + (uVar6 & 0xffffffffffffffe0));
      lVar8 = ((long)uVar6 >> 5) + 1;
      pHVar5 = pHVar5 + 2;
      do {
        if (pHVar5[-2].rank_ == iVar9) goto LAB_0011622c;
        if (pHVar5[-1].rank_ == iVar9) goto LAB_00116232;
        if (pHVar5->rank_ == iVar9) goto LAB_00116282;
        if (pHVar5[1].rank_ == iVar9) goto LAB_00116238;
        lVar8 = lVar8 + -1;
        pHVar5 = pHVar5 + 4;
      } while (1 < lVar8);
      uVar6 = (long)pHVar2 - (long)pHVar4;
      pHVar5 = pHVar4;
    }
    lVar8 = (long)uVar6 >> 3;
    if (lVar8 != 1) {
      if (lVar8 == 3) {
        if (pHVar5->rank_ == (int)cVar7) goto LAB_00116282;
        pHVar5 = pHVar5 + 1;
      }
      else if (lVar8 != 2) {
        return false;
      }
      if (pHVar5->rank_ == (int)cVar7) goto LAB_00116282;
      pHVar5 = pHVar5 + 1;
    }
    bVar10 = pHVar5->rank_ == (int)cVar7;
    break;
  case kDeal:
    if (this->cur_player_ != -1) {
      return false;
    }
    if ((this->deck_).card_count_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start
        [(move._3_4_ >> 0x18) * (this->deck_).num_ranks_ + ((int)move._4_4_ >> 0x18)] != 0) {
      return true;
    }
    return false;
  }
  if (!bVar10) {
    pHVar5 = pHVar2;
  }
LAB_00116282:
  if (pHVar5 != pHVar2) {
    return true;
  }
  return false;
LAB_0011622c:
  pHVar5 = pHVar5 + -2;
  goto LAB_00116282;
LAB_00116232:
  pHVar5 = pHVar5 + -1;
  goto LAB_00116282;
LAB_00116238:
  pHVar5 = pHVar5 + 1;
  goto LAB_00116282;
}

Assistant:

bool HanabiState::MoveIsLegal(HanabiMove move) const {
  switch (move.MoveType()) {
    case HanabiMove::kDeal:
      if (cur_player_ != kChancePlayerId) {
        return false;
      }
      if (deck_.CardCount(move.Color(), move.Rank()) == 0) {
        return false;
      }
      break;
    case HanabiMove::kDiscard:
      if (InformationTokens() >= ParentGame()->MaxInformationTokens()) {
        return false;
      }
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kPlay:
      if (move.CardIndex() >= hands_[cur_player_].Cards().size()) {
        return false;
      }
      break;
    case HanabiMove::kRevealColor: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Color() == move.Color();
                       })) {
        return false;
      }
      break;
    }
    case HanabiMove::kRevealRank: {
      if (!HintingIsLegal(move)) {
        return false;
      }
      const auto& cards = HandByOffset(move.TargetOffset()).Cards();
      if (!std::any_of(cards.begin(), cards.end(),
                       [move](const HanabiCard& card) {
                         return card.Rank() == move.Rank();
                       })) {
        return false;
      }
      break;
    }
    default:
      return false;
  }
  return true;
}